

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void gen_windowed_sines(int freq_count,double *freqs,double max,float *output,int output_len)

{
  float fVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar3 = (ulong)(uint)output_len;
  if (0 < output_len) {
    memset(output,0,uVar3 * 4);
  }
  if (0 < freq_count) {
    uVar4 = 0;
    do {
      if ((freqs[uVar4] <= 0.0) || (0.5 <= freqs[uVar4])) {
        printf("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n",
               "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/tests/util.c"
               ,uVar4 & 0xffffffff);
        exit(1);
      }
      if (0 < output_len) {
        lVar2 = 0;
        do {
          fVar1 = *(float *)((long)output + lVar2 * 2);
          dVar5 = sin((double)(int)lVar2 * freqs[uVar4] * 3.141592653589793 +
                      2.827433388230814 / (double)freq_count);
          *(float *)((long)output + lVar2 * 2) =
               (float)(dVar5 * (max / (double)freq_count) + (double)fVar1);
          lVar2 = lVar2 + 2;
        } while (uVar3 * 2 != lVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)freq_count);
  }
  if (0 < output_len) {
    lVar2 = 0;
    do {
      fVar1 = *(float *)((long)output + lVar2 * 2);
      dVar5 = cos(((double)(int)lVar2 * 3.141592653589793) / (double)(output_len + -1));
      *(float *)((long)output + lVar2 * 2) = (float)((dVar5 * -0.5 + 0.5) * (double)fVar1);
      lVar2 = lVar2 + 2;
    } while (uVar3 * 2 != lVar2);
  }
  return;
}

Assistant:

void
gen_windowed_sines (int freq_count, const double *freqs, double max, float *output, int output_len)
{	int 	k, freq ;
	double	amplitude, phase ;

	amplitude = max / freq_count ;

	for (k = 0 ; k < output_len ; k++)
		output [k] = 0.0 ;

	for (freq = 0 ; freq < freq_count ; freq++)
	{	phase = 0.9 * M_PI / freq_count ;

		if (freqs [freq] <= 0.0 || freqs [freq] >= 0.5)
		{	printf ("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n", __FILE__, freq, freqs [freq]) ;
			exit (1) ;
			} ;

		for (k = 0 ; k < output_len ; k++)
			output [k] = (float) (output [k] + (amplitude * sin (freqs [freq] * (2 * k) * M_PI + phase))) ;
		} ;

	/* Apply Hanning Window. */
	for (k = 0 ; k < output_len ; k++)
		output [k] = (float) (output [k] * (0.5 - 0.5 * cos ((2 * k) * M_PI / (output_len - 1)))) ;

	/*	data [k] *= 0.3635819 - 0.4891775 * cos ((2 * k) * M_PI / (output_len - 1))
					+ 0.1365995 * cos ((4 * k) * M_PI / (output_len - 1))
					- 0.0106411 * cos ((6 * k) * M_PI / (output_len - 1)) ;
		*/

	return ;
}